

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O2

void __thiscall
Assimp::BlenderImporter::AddSentinelTexture
          (BlenderImporter *this,aiMaterial *out,Material *mat,MTex *tex,ConversionData *conv_data)

{
  uint uVar1;
  char *pcVar2;
  aiString local_434;
  
  local_434.data[0] = '\0';
  memset(local_434.data + 1,0x1b,0x3ff);
  uVar1 = conv_data->sentinel_cnt;
  conv_data->sentinel_cnt = uVar1 + 1;
  pcVar2 = Blender::GetTextureTypeDisplayString
                     (((tex->tex).
                       super___shared_ptr<Assimp::Blender::Tex,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->type);
  local_434.length = snprintf(local_434.data,0x400,"Procedural,num=%i,type=%s",(ulong)uVar1,pcVar2);
  uVar1 = conv_data->next_texture[1];
  conv_data->next_texture[1] = uVar1 + 1;
  aiMaterial::AddProperty(out,&local_434,"$tex.file",1,uVar1);
  return;
}

Assistant:

void BlenderImporter::AddSentinelTexture(aiMaterial* out, const Material* mat, const MTex* tex, ConversionData& conv_data)
{
    (void)mat; (void)tex; (void)conv_data;

    aiString name;
    name.length = ai_snprintf(name.data, MAXLEN, "Procedural,num=%i,type=%s",conv_data.sentinel_cnt++,
        GetTextureTypeDisplayString(tex->tex->type)
    );
    out->AddProperty(&name,AI_MATKEY_TEXTURE_DIFFUSE(
        conv_data.next_texture[aiTextureType_DIFFUSE]++)
    );
}